

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_AllLite37_Test<absl::lts_20250127::Cord>::
~LiteTest_AllLite37_Test(LiteTest_AllLite37_Test<absl::lts_20250127::Cord> *this)

{
  LiteTest_AllLite37_Test<absl::lts_20250127::Cord> *this_local;
  
  ~LiteTest_AllLite37_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST(LiteTest, AllLite37) {
  {
    // MissedKeyWireFormat
    proto2_unittest::TestMapLite message;

    // No key field in wire format
    std::string data = "\x0A\x02\x10\x01";

    EXPECT_TRUE(message.ParseFromString(data));
    ASSERT_EQ(1, message.map_int32_int32().size());
    ASSERT_NE(message.map_int32_int32().find(0),
              message.map_int32_int32().end());
    EXPECT_EQ(1, message.map_int32_int32().at(0));
  }
}